

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::ModelDescription::SharedDtor(ModelDescription *this)

{
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena
            (&this->predictedfeaturename_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena
            (&this->predictedprobabilitiesname_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
  if ((this != (ModelDescription *)&_ModelDescription_default_instance_) &&
     (this->metadata_ != (Metadata *)0x0)) {
    (*(this->metadata_->super_MessageLite)._vptr_MessageLite[1])();
    return;
  }
  return;
}

Assistant:

void ModelDescription::SharedDtor() {
  predictedfeaturename_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  predictedprobabilitiesname_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (this != internal_default_instance()) {
    delete metadata_;
  }
}